

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_graph.h
# Opt level: O2

void __thiscall ListGraph::ListGraph(ListGraph *this,int node_count,int arc_count)

{
  ArrayIDFunc<int>::ArrayIDFunc((ArrayIDFunc<int> *)this,arc_count);
  (this->head).image_count_ = node_count;
  ArrayIDFunc<int>::ArrayIDFunc(&(this->tail).super_ArrayIDFunc<int>,arc_count);
  (this->tail).image_count_ = node_count;
  return;
}

Assistant:

ListGraph(int node_count, int arc_count)
        : head(arc_count, node_count)
        , tail(arc_count, node_count)
    {
    }